

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O1

int32 fread_retry(void *pointer,int32 size,int32 num_items,FILE *stream)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  
  __n = (size_t)num_items;
  iVar3 = 0x3c;
  iVar2 = 0;
  do {
    sVar1 = fread((void *)((long)iVar2 + (long)pointer),(long)size,__n,(FILE *)stream);
    __n = __n - sVar1;
    if (__n != 0) {
      if (iVar3 == 0x3c) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                       ,0x1b2,"fread() failed; retrying...\n");
      }
      else if (iVar3 == 0) {
        return -1;
      }
      iVar3 = iVar3 + -1;
      iVar2 = (int)sVar1 * size + iVar2;
      sleep(1);
    }
  } while (__n != 0);
  return num_items;
}

Assistant:

int32
fread_retry(void *pointer, int32 size, int32 num_items, FILE * stream)
{
    char *data;
    size_t n_items_read;
    size_t n_items_rem;
    uint32 n_retry_rem;
    int32 loc;

    n_retry_rem = FREAD_RETRY_COUNT;

    data = (char *)pointer;
    loc = 0;
    n_items_rem = num_items;

    do {
        n_items_read = fread(&data[loc], size, n_items_rem, stream);

        n_items_rem -= n_items_read;

        if (n_items_rem > 0) {
            /* an incomplete read occurred */

            if (n_retry_rem == 0)
                return -1;

            if (n_retry_rem == FREAD_RETRY_COUNT) {
                E_ERROR_SYSTEM("fread() failed; retrying...\n");
            }

            --n_retry_rem;

            loc += n_items_read * size;
#if !defined(_WIN32) && defined(HAVE_UNISTD_H)
            sleep(1);
#endif
        }
    } while (n_items_rem > 0);

    return num_items;
}